

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_helper.cpp
# Opt level: O0

Image * Image_Function_Helper::ExtractChannel
                  (ExtractChannelForm4 extractChannel,Image *in,uint8_t channelId)

{
  uint32_t uVar1;
  uint32_t uVar2;
  undefined1 in_CL;
  ImageTemplate<unsigned_char> *in_RDX;
  code *in_RSI;
  Image *in_RDI;
  Image *out;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffff90;
  Image *pIVar3;
  ImageTemplate<unsigned_char> *pIVar4;
  undefined4 in_stack_ffffffffffffffb8;
  
  pIVar3 = in_RDI;
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in_stack_ffffffffffffff90);
  pIVar4 = in_RDX;
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  PenguinV_Image::ImageTemplate<unsigned_char>::generate
            ((ImageTemplate<unsigned_char> *)CONCAT44(uVar1,in_stack_ffffffffffffffb8),
             (uint32_t)((ulong)pIVar4 >> 0x20),(uint32_t)pIVar4,(uint8_t)((ulong)pIVar3 >> 0x38),
             (uint8_t)((ulong)pIVar3 >> 0x30));
  uVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::width(in_RDX);
  uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::height(in_RDX);
  (*in_RSI)(in_RDX,0,0,pIVar3,0,0,uVar1,uVar2,in_CL);
  return in_RDI;
}

Assistant:

Image ExtractChannel( FunctionTable::ExtractChannelForm4 extractChannel,
                          const Image & in, uint8_t channelId )
    {
        Image_Function::ParameterValidation( in );

        Image out = in.generate( in.width(), in.height() );

        extractChannel( in, 0, 0, out, 0, 0, in.width(), in.height(), channelId );

        return out;
    }